

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::pN_plusequals_ANi(btLCP *this,btScalar *p,int i,int sign)

{
  int iVar1;
  int iVar2;
  btScalar *pbVar3;
  int j_1;
  int nN_1;
  int j;
  int nN;
  btScalar *ptgt;
  btScalar *aptr;
  int nC;
  int sign_local;
  int i_local;
  btScalar *p_local;
  btLCP *this_local;
  
  iVar1 = this->m_nC;
  pbVar3 = this->m_A[i];
  if (sign < 1) {
    iVar2 = this->m_nN;
    for (j_1 = 0; j_1 < iVar2; j_1 = j_1 + 1) {
      p[(long)iVar1 + (long)j_1] = p[(long)iVar1 + (long)j_1] - pbVar3[(long)iVar1 + (long)j_1];
    }
  }
  else {
    iVar2 = this->m_nN;
    for (j = 0; j < iVar2; j = j + 1) {
      p[(long)iVar1 + (long)j] = pbVar3[(long)iVar1 + (long)j] + p[(long)iVar1 + (long)j];
    }
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_ANi (btScalar *p, int i, int sign)
{
  const int nC = m_nC;
  btScalar *aptr = BTAROW(i) + nC;
  btScalar *ptgt = p + nC;
  if (sign > 0) {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] += aptr[j];
  }
  else {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] -= aptr[j];
  }
}